

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_active_uniform_block_name
               (NegativeTestContext *ctx)

{
  undefined *puVar1;
  deUint64 dVar2;
  GLuint program_00;
  deUint32 dVar3;
  RenderContext *renderCtx;
  TestLog *this;
  MessageBuilder *pMVar4;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  MessageBuilder local_458;
  GLchar local_2d8 [8];
  GLchar uniformBlockName [128];
  GLint numActiveBlocks;
  GLsizei length;
  GLuint shader;
  string local_228;
  allocator<char> local_1f1;
  string local_1f0;
  string local_1d0;
  ProgramSources local_1b0;
  undefined1 local_e0 [8];
  ShaderProgram program;
  NegativeTestContext *ctx_local;
  
  program.m_program.m_info.linkTimeUs = (deUint64)ctx;
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  puVar1 = uniformTestVertSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,puVar1,&local_1f1);
  getVtxFragVersionSources
            (&local_1d0,&local_1f0,(NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  puVar1 = uniformTestFragSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shader,puVar1,(allocator<char> *)((long)&length + 3));
  getVtxFragVersionSources
            (&local_228,(string *)&shader,(NegativeTestContext *)program.m_program.m_info.linkTimeUs
            );
  glu::makeVtxFragSources(&local_1b0,&local_1d0,&local_228);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e0,renderCtx,&local_1b0);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&shader);
  std::allocator<char>::~allocator((allocator<char> *)((long)&length + 3));
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  program_00 = glu::CallLogWrapper::glCreateShader
                         ((CallLogWrapper *)program.m_program.m_info.linkTimeUs,0x8b31);
  uniformBlockName[0x7c] = -1;
  uniformBlockName[0x7d] = -1;
  uniformBlockName[0x7e] = -1;
  uniformBlockName[0x7f] = -1;
  uniformBlockName[0x78] = -1;
  uniformBlockName[0x79] = -1;
  uniformBlockName[0x7a] = -1;
  uniformBlockName[0x7b] = -1;
  ::deMemset(local_2d8,0,0x80);
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glGetProgramiv
            ((CallLogWrapper *)dVar2,dVar3,0x8a36,(GLint *)(uniformBlockName + 0x78));
  this = glu::CallLogWrapper::getLog((CallLogWrapper *)program.m_program.m_info.linkTimeUs);
  tcu::TestLog::operator<<(&local_458,this,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<
                     (&local_458,(char (*) [31])"// GL_ACTIVE_UNIFORM_BLOCKS = ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)(uniformBlockName + 0x78));
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [15])" (expected 1).");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_458);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  dVar2 = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,
             "GL_INVALID_OPERATION is generated if program is the name of a shader object.",
             &local_479);
  NegativeTestContext::beginSection((NegativeTestContext *)dVar2,&local_478);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  glu::CallLogWrapper::glGetActiveUniformBlockName
            ((CallLogWrapper *)program.m_program.m_info.linkTimeUs,program_00,
             uniformBlockName._120_4_,0x8a3f,(GLsizei *)(uniformBlockName + 0x7c),local_2d8);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  NegativeTestContext::endSection((NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  dVar2 = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a0,
             "GL_INVALID_VALUE is generated if program is not the name of either a program or shader object."
             ,&local_4a1);
  NegativeTestContext::beginSection((NegativeTestContext *)dVar2,&local_4a0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  glu::CallLogWrapper::glGetActiveUniformBlockName
            ((CallLogWrapper *)program.m_program.m_info.linkTimeUs,0xffffffff,
             uniformBlockName._120_4_,0x8a3f,(GLsizei *)(uniformBlockName + 0x7c),local_2d8);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x501)
  ;
  NegativeTestContext::endSection((NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  dVar2 = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,
             "GL_INVALID_VALUE is generated if uniformBlockIndex is greater than or equal to the value of GL_ACTIVE_UNIFORM_BLOCKS or is not the index of an active uniform block in program."
             ,&local_4c9);
  NegativeTestContext::beginSection((NegativeTestContext *)dVar2,&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)dVar2,dVar3);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glGetActiveUniformBlockName
            ((CallLogWrapper *)dVar2,dVar3,uniformBlockName._120_4_,0x80,
             (GLsizei *)(uniformBlockName + 0x7c),local_2d8);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x501)
  ;
  NegativeTestContext::endSection((NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)program.m_program.m_info.linkTimeUs,0);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e0);
  return;
}

Assistant:

void get_active_uniform_block_name (NegativeTestContext& ctx)
{
	glu::ShaderProgram	program			(ctx.getRenderContext(), glu::makeVtxFragSources(getVtxFragVersionSources(uniformTestVertSource, ctx), getVtxFragVersionSources(uniformTestFragSource, ctx)));
	GLuint				shader			= ctx.glCreateShader(GL_VERTEX_SHADER);
	GLsizei				length			= -1;
	GLint				numActiveBlocks	= -1;
	GLchar				uniformBlockName[128];

	deMemset(&uniformBlockName[0], 0, sizeof(uniformBlockName));

	ctx.glGetProgramiv(program.getProgram(), GL_ACTIVE_UNIFORM_BLOCKS, &numActiveBlocks);
	ctx.getLog() << TestLog::Message << "// GL_ACTIVE_UNIFORM_BLOCKS = " << numActiveBlocks << " (expected 1)." << TestLog::EndMessage;
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is the name of a shader object.");
	ctx.glGetActiveUniformBlockName(shader, numActiveBlocks, GL_UNIFORM_BLOCK_BINDING, &length, &uniformBlockName[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not the name of either a program or shader object.");
	ctx.glGetActiveUniformBlockName(-1, numActiveBlocks, GL_UNIFORM_BLOCK_BINDING, &length, &uniformBlockName[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if uniformBlockIndex is greater than or equal to the value of GL_ACTIVE_UNIFORM_BLOCKS or is not the index of an active uniform block in program.");
	ctx.glUseProgram(program.getProgram());
	ctx.expectError(GL_NO_ERROR);
	ctx.glGetActiveUniformBlockName(program.getProgram(), numActiveBlocks, (int)sizeof(uniformBlockName), &length, &uniformBlockName[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glUseProgram(0);
}